

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.c
# Opt level: O0

Cpu_Register get_cb_register(CB_Code opcode)

{
  byte local_10;
  Cpu_Register CStack_c;
  uint8_t lower;
  CB_Code opcode_local;
  
  local_10 = (byte)opcode;
  switch(local_10 & 0xf) {
  case 0:
  case 8:
    CStack_c = Register_B;
    break;
  case 1:
  case 9:
    CStack_c = Register_C;
    break;
  case 2:
  case 10:
    CStack_c = Register_D;
    break;
  case 3:
  case 0xb:
    CStack_c = Register_E;
    break;
  case 4:
  case 0xc:
    CStack_c = Register_H;
    break;
  case 5:
  case 0xd:
    CStack_c = Register_L;
    break;
  case 7:
  case 0xe:
  default:
    CStack_c = Register_A;
  }
  return CStack_c;
}

Assistant:

Cpu_Register get_cb_register(CB_Code opcode) {
    uint8_t lower = (uint8_t) (opcode) & 0x0F;

    switch(lower) {
        case 0x00:
        case 0x08:
            return Register_B;
        case 0x01:
        case 0x09:
            return Register_C;
        case 0x02:
        case 0x0A:
            return Register_D;
        case 0x03:
        case 0x0B:
            return Register_E;
        case 0x04:
        case 0x0C:
            return Register_H;
        case 0x05:
        case 0x0D:
            return Register_L;
        case 0x07:
        case 0x0E:
        default:
            return Register_A;
    }
}